

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

pointer __thiscall QList<QMakeLocalFileName>::data(QList<QMakeLocalFileName> *this)

{
  QArrayDataPointer<QMakeLocalFileName> *this_00;
  QMakeLocalFileName *pQVar1;
  QArrayDataPointer<QMakeLocalFileName> *in_RDI;
  
  detach((QList<QMakeLocalFileName> *)0x1ea04c);
  this_00 = (QArrayDataPointer<QMakeLocalFileName> *)
            QArrayDataPointer<QMakeLocalFileName>::operator->(in_RDI);
  pQVar1 = QArrayDataPointer<QMakeLocalFileName>::data(this_00);
  return pQVar1;
}

Assistant:

pointer data() { detach(); return d->data(); }